

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall
cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive
          (cmFileListGeneratorCaseInsensitive *this)

{
  ~cmFileListGeneratorCaseInsensitive(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmFileListGeneratorCaseInsensitive(std::string const& str):
    cmFileListGeneratorBase(), String(str) {}